

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::CalcContactSystemVariables
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS)

{
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this;
  double dVar1;
  pointer pSVar2;
  ResScalar RVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  SpatialTransform *pSVar8;
  pointer pSVar9;
  uint body_id;
  uint uVar10;
  byte bVar11;
  Vector3d gamma_i;
  Vector3d local_a8;
  Vector3d prev_body_point;
  double local_48;
  double dStack_40;
  double local_38;
  
  bVar11 = 0;
  NonlinearEffects(model,Q,QDot,(VectorNd *)(CS + 0xc0));
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)(CS + 0xa8),false);
  uVar6 = 1;
  while( true ) {
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar6) break;
    Math::SpatialTransform::operator*
              ((SpatialTransform *)&prev_body_point,
               (model->X_lambda).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar6,
               (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6]);
    pSVar2 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar8 = (SpatialTransform *)&prev_body_point;
    pSVar9 = pSVar2 + uVar6;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(double *)&(pSVar9->E).super_Matrix3d =
           (pSVar8->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pSVar8 = (SpatialTransform *)((long)pSVar8 + (ulong)bVar11 * -0x10 + 8);
      pSVar9 = (pointer)((long)pSVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    *(double *)((long)&pSVar2[uVar6].r.super_Vector3d + 0x10) = local_38;
    *(double *)
     &pSVar2[uVar6].r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
         local_48;
    *(double *)
     ((long)&pSVar2[uVar6].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8) = dStack_40;
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  uVar10 = 0;
  CalcContactJacobian(model,Q,CS,(MatrixNd *)(CS + 0xe0),false);
  gamma_i.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&prev_body_point,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&gamma_i);
  local_a8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&gamma_i,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_a8);
  this = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(CS + 0x210);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero(this);
  UpdateKinematicsCustom(model,(VectorNd *)0x0,(VectorNd *)0x0,(VectorNd *)this);
  uVar5 = 0;
  do {
    uVar6 = (ulong)uVar5;
    if (*(ulong *)(CS + 0x70) <= uVar6) {
      return;
    }
    body_id = *(uint *)(*(long *)(CS + 0x20) + uVar6 * 4);
    if (uVar10 == body_id) {
      bVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator!=
                        ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&prev_body_point,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (uVar6 * 0x18 + *(long *)(CS + 0x38)));
      if (bVar4) {
        body_id = *(uint *)(*(long *)(CS + 0x20) + uVar6 * 4);
        goto LAB_00113ae9;
      }
    }
    else {
LAB_00113ae9:
      CalcPointAcceleration
                (&local_a8,model,Q,QDot,(VectorNd *)this,body_id,
                 (Vector3d *)(*(long *)(CS + 0x38) + uVar6 * 0x18),false);
      gamma_i.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           local_a8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
      gamma_i.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] =
           local_a8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
      gamma_i.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] =
           local_a8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      uVar10 = *(uint *)(*(long *)(CS + 0x20) + uVar6 * 4);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                (&prev_body_point.super_Vector3d,
                 (Matrix<double,_3,_1,_0,_3,_1> *)(uVar6 * 0x18 + *(long *)(CS + 0x38)));
    }
    dVar1 = *(double *)(*(long *)(CS + 0x68) + uVar6 * 8);
    RVar3 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  (uVar6 * 0x18 + *(long *)(CS + 0x50)),
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&gamma_i);
    *(double *)(*(long *)(CS + 0xd0) + uVar6 * 8) = dVar1 - RVar3;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
void CalcContactSystemVariables (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDot,
		const Math::VectorNd &Tau,
		ConstraintSet &CS
		) {
	// Compute C
	NonlinearEffects (model, Q, QDot, CS.C);
	assert (CS.H.cols() == model.dof_count && CS.H.rows() == model.dof_count);

	// Compute H
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	// We have to update model.X_base as they are not automatically computed
	// by NonlinearEffects()
	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		model.X_base[i] = model.X_lambda[i] * model.X_base[model.lambda[i]];
	}
	CalcContactJacobian (model, Q, CS, CS.G, false);

	// Compute gamma
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	Vector3d gamma_i = Vector3d::Zero();

	CS.QDDot_0.setZero();
	UpdateKinematicsCustom (model, NULL, NULL, &CS.QDDot_0);

	for (unsigned int i = 0; i < CS.size(); i++) {
		// only compute point accelerations when necessary
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			gamma_i = CalcPointAcceleration (model, Q, QDot, CS.QDDot_0, CS.body[i], CS.point[i], false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		// we also substract ContactData[i].acceleration such that the contact
		// point will have the desired acceleration
		CS.gamma[i] = CS.acceleration[i] - CS.normal[i].dot(gamma_i);
	}
}